

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

DecodeStatus decodeBDVAddr12Operand(MCInst *Inst,uint64_t Field,uint *Regs)

{
  ulong uVar1;
  long in_RDX;
  ulong in_RSI;
  MCInst *in_RDI;
  uint64_t Disp;
  uint64_t Base;
  uint64_t Index;
  uint local_3c;
  
  uVar1 = in_RSI >> 0xc & 0xf;
  if (uVar1 == 0) {
    local_3c = 0;
  }
  else {
    local_3c = *(uint *)(in_RDX + uVar1 * 4);
  }
  MCOperand_CreateReg0(in_RDI,local_3c);
  MCOperand_CreateImm0(in_RDI,in_RSI & 0xfff);
  MCOperand_CreateReg0(in_RDI,SystemZMC_VR128Regs[in_RSI >> 0x10]);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus decodeBDVAddr12Operand(MCInst *Inst, uint64_t Field,
		const unsigned *Regs)
{
	uint64_t Index = Field >> 16;
	uint64_t Base = (Field >> 12) & 0xf;
	uint64_t Disp = Field & 0xfff;
	//assert(Index < 32 && "Invalid BDVAddr12");

	MCOperand_CreateReg0(Inst, Base == 0 ? 0 : Regs[Base]);
	MCOperand_CreateImm0(Inst, Disp);
	MCOperand_CreateReg0(Inst, SystemZMC_VR128Regs[Index]);

	return MCDisassembler_Success;
}